

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O2

st__table * Abc_NtkRetimePrepareLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  st__table *table;
  long *key;
  long lVar5;
  
  iVar1 = pNtk->nObjCounts[8];
  iVar2 = pNtk->vBoxes->nSize;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  for (lVar5 = 0; lVar5 < pNtk->vBoxes->nSize; lVar5 = lVar5 + 1) {
    key = (long *)Vec_PtrEntry(pNtk->vBoxes,(int)lVar5);
    if ((*(uint *)((long)key + 0x14) & 0xf) == 8) {
      st__insert(table,(char *)key,(char *)(long)((iVar1 - iVar2) + (int)lVar5));
      pAVar3 = *(Abc_Obj_t **)(*(long *)(*(long *)(*key + 0x20) + 8) + (long)*(int *)key[4] * 8);
      pAVar4 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      Abc_ObjTransferFanout(pAVar3,pAVar4);
      Abc_ObjDeleteFanin(pAVar3,pAVar4);
      pAVar3 = *(Abc_Obj_t **)(*(long *)(*(long *)(*key + 0x20) + 8) + (long)*(int *)key[6] * 8);
      pAVar4 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      if (0 < (pAVar3->vFanouts).nSize) {
        Abc_ObjTransferFanout(pAVar3,pAVar4);
      }
      Abc_ObjDeleteFanin(pAVar3,pAVar4);
    }
  }
  return table;
}

Assistant:

st__table * Abc_NtkRetimePrepareLatches( Abc_Ntk_t * pNtk )
{
    st__table * tLatches;
    Abc_Obj_t * pLatch, * pLatchIn, * pLatchOut, * pFanin;
    int i, nOffSet = Abc_NtkBoxNum(pNtk) - Abc_NtkLatchNum(pNtk);
    // collect latches and remove CIs/COs
    tLatches = st__init_table( st__ptrcmp, st__ptrhash );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        // map latch into its true number
        st__insert( tLatches, (char *)(ABC_PTRUINT_T)pLatch, (char *)(ABC_PTRUINT_T)(i-nOffSet) );
        // disconnect LI     
        pLatchIn = Abc_ObjFanin0(pLatch);
        pFanin = Abc_ObjFanin0(pLatchIn);
        Abc_ObjTransferFanout( pLatchIn, pFanin );
        Abc_ObjDeleteFanin( pLatchIn, pFanin );
        // disconnect LO     
        pLatchOut = Abc_ObjFanout0(pLatch);
        pFanin = Abc_ObjFanin0(pLatchOut);
        if ( Abc_ObjFanoutNum(pLatchOut) > 0 )
            Abc_ObjTransferFanout( pLatchOut, pFanin );
        Abc_ObjDeleteFanin( pLatchOut, pFanin );
    }
    return tLatches;
}